

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

BlockInfo * __thiscall
Wasm::WasmBytecodeGenerator::PushLabel
          (WasmBytecodeGenerator *this,WasmBlock blockData,ByteCodeLabel label,
          bool addBlockYieldInfo,bool checkInParams)

{
  IWasmByteCodeWriter *pIVar1;
  anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 aVar2;
  ArgSlot AVar3;
  OpCodeAsmJs OVar4;
  WasmType WVar5;
  EmitInfoBase EVar6;
  uint32 uVar7;
  Local LVar8;
  RegSlot RVar9;
  EmitInfo EVar10;
  WasmRegisterSpace *pWVar11;
  WasmSignature *this_00;
  EmitInfo EVar12;
  undefined7 in_register_00000009;
  EmitInfo EVar13;
  uint32 i;
  uint32 index;
  uint uVar14;
  uint32 i_1;
  int iVar15;
  EmitInfo local_80;
  EmitInfo param;
  undefined1 local_70 [8];
  PolymorphicEmitInfo inParams;
  WasmBlock local_50;
  WasmBlock blockData_local;
  
  blockData_local = (WasmBlock)&this->m_alloc;
  local_50 = blockData;
  EVar10 = (EmitInfo)new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)blockData_local,0x364470);
  *(undefined8 *)EVar10 = 0;
  ((anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 *)((long)EVar10 + 8))->infos = (EmitInfo *)0x0
  ;
  *(undefined8 *)((long)EVar10 + 0x10) = 0;
  ((anon_union_8_2_2e7736b0_for_PolymorphicEmitInfo_1 *)((long)EVar10 + 0x18))->infos =
       (EmitInfo *)0x0;
  *(undefined8 *)((long)EVar10 + 0x20) = 0;
  *(ByteCodeLabel *)((long)EVar10 + 0x24) = label;
  if ((int)CONCAT71(in_register_00000009,addBlockYieldInfo) != 0) {
    inParams.field_1.infos = (EmitInfo *)((long)EVar10 + 0x10);
    if (((ulong)blockData & 1) == 0) {
      param = EVar10;
      uVar7 = WasmBlock::GetSignatureId(&local_50);
      this_00 = Js::WebAssemblyModule::GetSignature(this->m_module,uVar7);
      AVar3 = WasmSignature::GetParamCount(this_00);
      local_70._0_4_ = 0;
      inParams.count = 0;
      inParams._4_4_ = 0;
      if (AVar3 != 0 && checkInParams) {
        PolymorphicEmitInfo::Init
                  ((PolymorphicEmitInfo *)local_70,(uint)AVar3,(ArenaAllocator *)blockData_local);
        uVar14 = AVar3 + 1;
        do {
          LVar8 = WasmSignature::GetParam(this_00,(short)uVar14 - 2);
          EVar10 = PopEvalStack(this,LVar8,(char16 *)0x0);
          local_80 = EVar10;
          ReleaseLocation(this,&local_80);
          PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)local_70,EVar10,uVar14 - 2 & 0xffff);
          uVar14 = uVar14 - 1;
        } while (1 < uVar14);
      }
      aVar2 = inParams.field_1;
      uVar7 = this_00->m_resultsCount;
      if (uVar7 != 0) {
        PolymorphicEmitInfo::Init
                  ((PolymorphicEmitInfo *)inParams.field_1.infos,uVar7,
                   (ArenaAllocator *)blockData_local);
        index = 0;
        do {
          LVar8 = WasmSignature::GetResult(this_00,index);
          pWVar11 = GetRegisterSpace(this,LVar8);
          EVar6.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar11);
          EVar10.type = LVar8;
          EVar10.super_EmitInfoBase.location = EVar6.location;
          PolymorphicEmitInfo::SetInfo((PolymorphicEmitInfo *)aVar2.infos,EVar10,index);
          index = index + 1;
        } while (uVar7 != index);
      }
      EVar10 = param;
      if (AVar3 != 0 && checkInParams) {
        uVar14 = (uint)AVar3;
        PolymorphicEmitInfo::Init
                  ((PolymorphicEmitInfo *)param,uVar14,(ArenaAllocator *)blockData_local);
        uVar7 = 0;
        do {
          EVar13 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)local_70,uVar7);
          pWVar11 = GetRegisterSpace(this,EVar13.type);
          RVar9 = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar11);
          PolymorphicEmitInfo::SetInfo
                    ((PolymorphicEmitInfo *)EVar10,
                     (EmitInfo)((ulong)RVar9 | (ulong)EVar13 & 0xffffffff00000000),uVar7);
          uVar7 = uVar7 + 1;
        } while (uVar14 != uVar7);
        iVar15 = uVar14 + 1;
        do {
          EVar13 = PolymorphicEmitInfo::GetInfo
                             ((PolymorphicEmitInfo *)local_70,iVar15 - 2U & 0xffff);
          EVar12 = PolymorphicEmitInfo::GetInfo((PolymorphicEmitInfo *)EVar10,iVar15 - 2U & 0xffff);
          pIVar1 = this->m_writer;
          OVar4 = GetLoadOp(this,EVar12.type);
          (*pIVar1->_vptr_IWasmByteCodeWriter[0xf])
                    (pIVar1,(ulong)OVar4,(ulong)EVar12 & 0xffffffff,(ulong)EVar13 & 0xffffffff);
          iVar15 = iVar15 + -1;
        } while (1 < iVar15);
      }
    }
    else {
      WVar5 = WasmBlock::GetSingleResult(&local_50);
      aVar2 = inParams.field_1;
      if (WVar5 != Void) {
        WVar5 = WasmBlock::GetSingleResult(&local_50);
        pWVar11 = GetRegisterSpace(this,WVar5);
        EVar6.location = WAsmJs::RegisterSpace::AcquireTmpRegister(pWVar11);
        WVar5 = WasmBlock::GetSingleResult(&local_50);
        EVar13.type = WVar5;
        EVar13.super_EmitInfoBase.location = EVar6.location;
        PolymorphicEmitInfo::Init((PolymorphicEmitInfo *)aVar2.infos,EVar13);
      }
    }
  }
  JsUtil::
  List<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(&(this->m_blockInfos).list,0);
  iVar15 = (this->m_blockInfos).list.
           super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count;
  *(EmitInfo *)
   ((this->m_blockInfos).list.
    super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.buffer + iVar15)
       = EVar10;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count = iVar15 + 1;
  return (BlockInfo *)EVar10;
}

Assistant:

BlockInfo* WasmBytecodeGenerator::PushLabel(WasmBlock blockData, Js::ByteCodeLabel label, bool addBlockYieldInfo, bool checkInParams)
{
    BlockInfo* blockInfo = Anew(&m_alloc, BlockInfo);
    blockInfo->label = label;
    if (addBlockYieldInfo)
    {
        if (blockData.IsSingleResult())
        {
            if (blockData.GetSingleResult() != WasmTypes::Void)
            {
                blockInfo->yieldInfo.Init(EmitInfo(GetRegisterSpace(blockData.GetSingleResult())->AcquireTmpRegister(), blockData.GetSingleResult()));
            }
        }
        else
        {
            uint32 sigId = blockData.GetSignatureId();
            WasmSignature* signature = m_module->GetSignature(sigId);

            Js::ArgSlot paramCount = signature->GetParamCount();
            checkInParams = checkInParams && paramCount > 0;
            PolymorphicEmitInfo inParams;
            if (checkInParams)
            {
                inParams.Init(paramCount, &m_alloc);
                // Pop the params in reverse order
                for (int i = paramCount - 1; i >= 0; --i)
                {
                    Js::ArgSlot iArg = (Js::ArgSlot)i;
                    EmitInfo param = PopEvalStack(signature->GetParam(iArg));
                    ReleaseLocation(&param);
                    inParams.SetInfo(param, iArg);
                }
            }

            uint32 resultCount = signature->GetResultCount();
            if (resultCount > 0)
            {
                blockInfo->yieldInfo.Init(resultCount, &m_alloc);
                for (uint32 i = 0; i < resultCount; ++i)
                {
                    WasmTypes::WasmType type = signature->GetResult(i);
                    blockInfo->yieldInfo.SetInfo(EmitInfo(GetRegisterSpace(type)->AcquireTmpRegister(), type), i);
                }
            }

            if (checkInParams)
            {
                blockInfo->paramInfo.Init(paramCount, &m_alloc);
                // Acquire tmp registers in order
                for (uint32 i = 0; i < paramCount; ++i)
                {
                    EmitInfo info = inParams.GetInfo(i);
                    EmitInfo newInfo = info;
                    newInfo.location = GetRegisterSpace(info.type)->AcquireTmpRegister();
                    blockInfo->paramInfo.SetInfo(newInfo, i);
                }
                // Todo:: Instead of moving inparams to new location,
                // Treat inparams as local and bypass ReleaseLocation until we exit the scope

                // Move in params to new location in reverse order
                for (int i = paramCount - 1; i >= 0; --i)
                {
                    Js::ArgSlot iArg = (Js::ArgSlot)i;
                    EmitInfo info = inParams.GetInfo(iArg);
                    EmitInfo newInfo = blockInfo->paramInfo.GetInfo(iArg);
                    m_writer->AsmReg2(GetLoadOp(newInfo.type), newInfo.location, info.location);
                }
            }
        }
    }
    m_blockInfos.Push(blockInfo);
    return blockInfo;
}